

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_fstat(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_buf_t uVar4;
  char *local_278;
  size_t local_270;
  undefined1 local_268 [8];
  stat t;
  uv_stat_t *s;
  undefined1 local_1c8 [4];
  uv_file file;
  uv_fs_t req;
  int r;
  
  unlink("test_file");
  loop = uv_default_loop();
  req.bufsml[3].len._4_4_ =
       uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x52f,"r >= 0");
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x530,"req.result >= 0");
    abort();
  }
  iVar2 = (int)req.cb;
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  iVar1 = fstat64(iVar2,(stat64 *)local_268);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x535,"0 == fstat(file, &t)");
    abort();
  }
  iVar1 = uv_fs_fstat((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,iVar2,(uv_fs_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x536,"0 == uv_fs_fstat(NULL, &req, file, NULL)");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x537,"req.result == 0");
    abort();
  }
  t.__glibc_reserved[2] = req.result;
  if ((*(long *)(req.result + 0x90) != 0) && (*(long *)(req.result + 0x90) != t.st_mtim.tv_nsec)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x541,"s->st_birthtim.tv_sec == 0 || s->st_birthtim.tv_sec == t.st_ctim.tv_sec");
    abort();
  }
  if ((*(long *)(req.result + 0x98) != 0) && (*(long *)(req.result + 0x98) != t.st_ctim.tv_sec)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x543,"s->st_birthtim.tv_nsec == 0 || s->st_birthtim.tv_nsec == t.st_ctim.tv_nsec");
    abort();
  }
  uVar4 = uv_buf_init(test_buf,0xd);
  local_278 = uVar4.base;
  iov.base = local_278;
  local_270 = uVar4.len;
  iov.len = local_270;
  req.bufsml[3].len._4_4_ =
       uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,iVar2,&iov,1,-1,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x549,"r == sizeof(test_buf)");
    abort();
  }
  if (req.cb != (uv_fs_cb)0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x54a,"req.result == sizeof(test_buf)");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  memset(&req.path,0xaa,0xa0);
  req.bufsml[3].len._4_4_ = uv_fs_fstat((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,iVar2,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x54f,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x550,"req.result == 0");
    abort();
  }
  t.__glibc_reserved[2] = req.result;
  if (*(long *)(req.result + 0x38) != 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x552,"s->st_size == sizeof(test_buf)");
    abort();
  }
  req.bufsml[3].len._4_4_ = fstat64(iVar2,(stat64 *)local_268);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x556,"r == 0");
    abort();
  }
  if ((undefined1  [8])*(__dev_t *)t.__glibc_reserved[2] != local_268) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x558,"s->st_dev == (uint64_t) t.st_dev");
    abort();
  }
  if (*(ulong *)(t.__glibc_reserved[2] + 8) != (ulong)(uint)t.st_nlink) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x559,"s->st_mode == (uint64_t) t.st_mode");
    abort();
  }
  if (*(__ino_t *)(t.__glibc_reserved[2] + 0x10) != t.st_ino) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x55a,"s->st_nlink == (uint64_t) t.st_nlink");
    abort();
  }
  if (*(ulong *)(t.__glibc_reserved[2] + 0x18) != (ulong)t.st_nlink._4_4_) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x55b,"s->st_uid == (uint64_t) t.st_uid");
    abort();
  }
  if (*(ulong *)(t.__glibc_reserved[2] + 0x20) != (ulong)t.st_mode) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x55c,"s->st_gid == (uint64_t) t.st_gid");
    abort();
  }
  if (*(long *)(t.__glibc_reserved[2] + 0x28) != t._32_8_) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x55d,"s->st_rdev == (uint64_t) t.st_rdev");
    abort();
  }
  if (*(__dev_t *)(t.__glibc_reserved[2] + 0x30) != t.st_dev) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x55e,"s->st_ino == (uint64_t) t.st_ino");
    abort();
  }
  if (*(__dev_t *)(t.__glibc_reserved[2] + 0x38) != t.st_rdev) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x55f,"s->st_size == (uint64_t) t.st_size");
    abort();
  }
  if (*(long *)(t.__glibc_reserved[2] + 0x40) != t.st_size) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x560,"s->st_blksize == (uint64_t) t.st_blksize");
    abort();
  }
  if (*(long *)(t.__glibc_reserved[2] + 0x48) != t.st_blksize) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x561,"s->st_blocks == (uint64_t) t.st_blocks");
    abort();
  }
  if (*(long *)(t.__glibc_reserved[2] + 0x60) != t.st_blocks) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x581,"s->st_atim.tv_sec == t.st_atim.tv_sec");
    abort();
  }
  if (*(long *)(t.__glibc_reserved[2] + 0x68) != t.st_atim.tv_sec) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x582,"s->st_atim.tv_nsec == t.st_atim.tv_nsec");
    abort();
  }
  if (*(long *)(t.__glibc_reserved[2] + 0x70) != t.st_atim.tv_nsec) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x583,"s->st_mtim.tv_sec == t.st_mtim.tv_sec");
    abort();
  }
  if (*(long *)(t.__glibc_reserved[2] + 0x78) != t.st_mtim.tv_sec) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x584,"s->st_mtim.tv_nsec == t.st_mtim.tv_nsec");
    abort();
  }
  if (*(long *)(t.__glibc_reserved[2] + 0x80) != t.st_mtim.tv_nsec) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x585,"s->st_ctim.tv_sec == t.st_ctim.tv_sec");
    abort();
  }
  if (*(long *)(t.__glibc_reserved[2] + 0x88) != t.st_ctim.tv_sec) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x586,"s->st_ctim.tv_nsec == t.st_ctim.tv_nsec");
    abort();
  }
  if (*(long *)(t.__glibc_reserved[2] + 0x50) != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x59a,"s->st_flags == 0");
    abort();
  }
  if (*(long *)(t.__glibc_reserved[2] + 0x58) != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x59b,"s->st_gen == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  req.bufsml[3].len._4_4_ = uv_fs_fstat(loop,(uv_fs_t *)local_1c8,iVar2,fstat_cb);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5a2,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (fstat_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5a4,"fstat_cb_count == 1");
    abort();
  }
  req.bufsml[3].len._4_4_ = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,iVar2,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5a8,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5a9,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  uv_run(loop,UV_RUN_DEFAULT);
  unlink("test_file");
  puVar3 = uv_default_loop();
  close_loop(puVar3);
  puVar3 = uv_default_loop();
  iVar2 = uv_loop_close(puVar3);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5b5,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_fstat) {
  int r;
  uv_fs_t req;
  uv_file file;
  uv_stat_t* s;
#ifndef _WIN32
  struct stat t;
#endif

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

#ifndef _WIN32
  ASSERT(0 == fstat(file, &t));
  ASSERT(0 == uv_fs_fstat(NULL, &req, file, NULL));
  ASSERT(req.result == 0);
  s = req.ptr;
# if defined(__APPLE__)
  ASSERT(s->st_birthtim.tv_sec == t.st_birthtimespec.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == t.st_birthtimespec.tv_nsec);
# elif defined(__linux__)
  /* If statx() is supported, the birth time should be equal to the change time
   * because we just created the file. On older kernels, it's set to zero.
   */
  ASSERT(s->st_birthtim.tv_sec == 0 ||
         s->st_birthtim.tv_sec == t.st_ctim.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == 0 ||
         s->st_birthtim.tv_nsec == t.st_ctim.tv_nsec);
# endif
#endif

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  memset(&req.statbuf, 0xaa, sizeof(req.statbuf));
  r = uv_fs_fstat(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  s = req.ptr;
  ASSERT(s->st_size == sizeof(test_buf));

#ifndef _WIN32
  r = fstat(file, &t);
  ASSERT(r == 0);

  ASSERT(s->st_dev == (uint64_t) t.st_dev);
  ASSERT(s->st_mode == (uint64_t) t.st_mode);
  ASSERT(s->st_nlink == (uint64_t) t.st_nlink);
  ASSERT(s->st_uid == (uint64_t) t.st_uid);
  ASSERT(s->st_gid == (uint64_t) t.st_gid);
  ASSERT(s->st_rdev == (uint64_t) t.st_rdev);
  ASSERT(s->st_ino == (uint64_t) t.st_ino);
  ASSERT(s->st_size == (uint64_t) t.st_size);
  ASSERT(s->st_blksize == (uint64_t) t.st_blksize);
  ASSERT(s->st_blocks == (uint64_t) t.st_blocks);
#if defined(__APPLE__)
  ASSERT(s->st_atim.tv_sec == t.st_atimespec.tv_sec);
  ASSERT(s->st_atim.tv_nsec == t.st_atimespec.tv_nsec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtimespec.tv_sec);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtimespec.tv_nsec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctimespec.tv_sec);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctimespec.tv_nsec);
#elif defined(_AIX)
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == 0);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == 0);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == 0);
#elif defined(__ANDROID__)
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == t.st_atimensec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtimensec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctimensec);
#elif defined(__sun)           || \
      defined(__DragonFly__)   || \
      defined(__FreeBSD__)     || \
      defined(__OpenBSD__)     || \
      defined(__NetBSD__)      || \
      defined(_GNU_SOURCE)     || \
      defined(_BSD_SOURCE)     || \
      defined(_SVID_SOURCE)    || \
      defined(_XOPEN_SOURCE)   || \
      defined(_DEFAULT_SOURCE)
  ASSERT(s->st_atim.tv_sec == t.st_atim.tv_sec);
  ASSERT(s->st_atim.tv_nsec == t.st_atim.tv_nsec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtim.tv_sec);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtim.tv_nsec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctim.tv_sec);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctim.tv_nsec);
# if defined(__FreeBSD__)    || \
     defined(__NetBSD__)
  ASSERT(s->st_birthtim.tv_sec == t.st_birthtim.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == t.st_birthtim.tv_nsec);
# endif
#else
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == 0);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == 0);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == 0);
#endif
#endif

#if defined(__APPLE__) || defined(__FreeBSD__) || defined(__NetBSD__)
  ASSERT(s->st_flags == t.st_flags);
  ASSERT(s->st_gen == t.st_gen);
#else
  ASSERT(s->st_flags == 0);
  ASSERT(s->st_gen == 0);
#endif

  uv_fs_req_cleanup(&req);

  /* Now do the uv_fs_fstat call asynchronously */
  r = uv_fs_fstat(loop, &req, file, fstat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fstat_cb_count == 1);


  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}